

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_attribute_endLocationExpression
               (sysbvm_dwarf_debugInfo_builder_t *builder)

{
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  sysbvm_dwarf_encodeULEB128(&builder->info,(builder->locationExpression).size);
  sysbvm_dynarray_addAll
            (&builder->info,(builder->locationExpression).size,(builder->locationExpression).data);
  (builder->locationExpression).size = 0;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_endLocationExpression(sysbvm_dwarf_debugInfo_builder_t *builder)
{
    sysbvm_dwarf_encodeULEB128(&builder->info, builder->locationExpression.size);
    sysbvm_dynarray_addAll(&builder->info, builder->locationExpression.size, builder->locationExpression.data);
    builder->locationExpression.size = 0;
}